

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall StripAnsiEscapeCodesStripColors::Run(StripAnsiEscapeCodesStripColors *this)

{
  Test *this_00;
  bool condition;
  undefined1 local_68 [8];
  string stripped;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string input;
  StripAnsiEscapeCodesStripColors *this_local;
  
  input.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "\x1b[1maffixmgr.cxx:286:15: \x1b[0m\x1b[0;1;35mwarning: \x1b[0m\x1b[1musing the result... [-Wparentheses]\x1b[0m"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  StripAnsiEscapeCodes((string *)local_68,(string *)local_30);
  this_00 = g_current_test;
  condition = std::operator==("affixmgr.cxx:286:15: warning: using the result... [-Wparentheses]",
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x198,
             "\"affixmgr.cxx:286:15: warning: using the result... [-Wparentheses]\" == stripped");
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(StripAnsiEscapeCodes, StripColors) {
  // An actual clang warning.
  string input = "\33[1maffixmgr.cxx:286:15: \33[0m\33[0;1;35mwarning: "
                 "\33[0m\33[1musing the result... [-Wparentheses]\33[0m";
  string stripped = StripAnsiEscapeCodes(input);
  EXPECT_EQ("affixmgr.cxx:286:15: warning: using the result... [-Wparentheses]",
            stripped);
}